

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_reader.cpp
# Opt level: O2

size_t __thiscall ximu::PacketReader::PacketSize(PacketReader *this,PacketHeaders header)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar2 = 0x14;
  if (header != CAL_INERTIAL_AND_MAGNETIC_DATA) {
    sVar2 = 0;
  }
  sVar1 = 10;
  if (header != QUATERNION_DATA) {
    sVar1 = sVar2;
  }
  return sVar1;
}

Assistant:

size_t PacketReader::PacketSize(ximu::PacketHeaders header) {
  switch (header) {
    case ximu::PacketHeaders::QUATERNION_DATA:
      return 10;
    case ximu::PacketHeaders::CAL_INERTIAL_AND_MAGNETIC_DATA:
      return 20;
    }

  return 0;
}